

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O0

void __thiscall highs::parallel::TaskGroup::~TaskGroup(TaskGroup *this)

{
  TaskGroup *in_RDI;
  TaskGroup *unaff_retaddr;
  
  cancel(unaff_retaddr);
  taskWait(in_RDI);
  return;
}

Assistant:

~TaskGroup() {
    cancel();
    taskWait();
  }